

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O2

Sequence<Protein> * __thiscall
Sequence<Protein>::Subsequence
          (Sequence<Protein> *__return_storage_ptr__,Sequence<Protein> *this,size_t pos,size_t len_)

{
  Sequence<Protein> *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  Sequence<Protein> *local_40;
  allocator local_32;
  allocator local_31;
  
  local_40 = __return_storage_ptr__;
  if (pos < (this->sequence)._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&this->sequence);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,"",&local_32);
  }
  if (pos < (this->quality)._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)&this->quality);
  }
  else {
    std::__cxx11::string::string((string *)&local_60,"",&local_31);
  }
  pSVar1 = local_40;
  Sequence(local_40,&this->identifier,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return pSVar1;
}

Assistant:

Sequence< A > Sequence< A >::Subsequence( const size_t pos,
                                          const size_t len_ ) const {
  size_t len = len_;
  if( len == std::string::npos ) {
    len = Length() - pos;
  }

  return Sequence( identifier,
                   pos < sequence.length() ? sequence.substr( pos, len ) : "",
                   pos < quality.length() ? quality.substr( pos, len ) : "" );
}